

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<double> * __thiscall
QList<double>::fill(QList<double> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<double> *pQVar3;
  __off_t __length;
  char *in_RSI;
  QArrayDataPointer<double> *in_RDI;
  long in_FS_OFFSET;
  double copy;
  DataPointer detached;
  QArrayDataPointer<double> *in_stack_ffffffffffffff68;
  QArrayDataPointer<double> *in_stack_ffffffffffffff70;
  char *pcVar4;
  parameter_type in_stack_ffffffffffffff78;
  QArrayDataPointer<double> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  QArrayDataPointer<double> *in_stack_ffffffffffffff90;
  qsizetype local_30;
  QArrayDataPointer<double> local_28;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  if (in_RSI == (char *)0xffffffffffffffff) {
    local_10 = (char *)size((QList<double> *)in_RDI);
  }
  QArrayDataPointer<double>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<double>::needsDetach(in_stack_ffffffffffffff70);
  pcVar4 = local_10;
  if ((bVar1) || (qVar2 = capacity((QList<double> *)0x8aabb3), qVar2 < (long)pcVar4)) {
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (double *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<double>::operator->(in_RDI);
    QArrayDataPointer<double>::detachCapacity
              (in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
    QArrayDataPointer<double>::QArrayDataPointer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,
               (AllocationOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<double>::operator->(&local_28);
    QtPrivate::QPodArrayOps<double>::copyAppend
              ((QPodArrayOps<double> *)in_stack_ffffffffffffff80,
               (qsizetype)in_stack_ffffffffffffff78,(parameter_type)in_stack_ffffffffffffff70);
    QArrayDataPointer<double>::swap(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<double>::~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    QArrayDataPointer<double>::operator->(in_RDI);
    QArrayDataPointer<double>::begin((QArrayDataPointer<double> *)0x8aac7e);
    QArrayDataPointer<double>::begin((QArrayDataPointer<double> *)0x8aac8d);
    local_30 = size((QList<double> *)in_RDI);
    qMin<long_long>(&local_30,(longlong *)&local_10);
    QtPrivate::QPodArrayOps<double>::assign
              ((QPodArrayOps<double> *)in_stack_ffffffffffffff70,(double *)in_stack_ffffffffffffff68
               ,(double *)0x8aacd7,in_stack_ffffffffffffff78);
    pcVar4 = local_10;
    qVar2 = size((QList<double> *)in_RDI);
    if (qVar2 < (long)pcVar4) {
      pQVar3 = (QPodArrayOps<double> *)QArrayDataPointer<double>::operator->(in_RDI);
      pcVar4 = local_10;
      size((QList<double> *)in_RDI);
      QtPrivate::QPodArrayOps<double>::copyAppend
                (pQVar3,(qsizetype)pcVar4,(parameter_type)in_stack_ffffffffffffff70);
    }
    else {
      pcVar4 = local_10;
      qVar2 = size((QList<double> *)in_RDI);
      if ((long)pcVar4 < qVar2) {
        pQVar3 = (QPodArrayOps<double> *)QArrayDataPointer<double>::operator->(in_RDI);
        QtPrivate::QPodArrayOps<double>::truncate(pQVar3,local_10,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<double> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}